

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  undefined1 *this_00;
  void *pvVar1;
  
  this_00 = &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x48 = 0x92b6b8;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x30 = 0x92b7f8;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x92b6e0;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xe0 = 0x92b708;
  *(undefined8 *)
   &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x118 = 0x92b730;
  *(undefined8 *)&this[-1].super_IfcStructuralSurfaceMember.field_0x148 = 0x92b758;
  *(undefined8 *)&this[-1].super_IfcStructuralSurfaceMember.Thickness.have = 0x92b780;
  *(undefined8 *)&this[-1].super_IfcStructuralSurfaceMember.field_0x168 = 0x92b7a8;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x92b7d0;
  pvVar1 = *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
                      super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcStructuralSurfaceMember).
                                     super_IfcStructuralMember.super_IfcStructuralItem.
                                     super_IfcProduct.super_IfcObject.field_0x20 - (long)pvVar1);
  }
  IfcStructuralSurfaceMember::~IfcStructuralSurfaceMember
            ((IfcStructuralSurfaceMember *)this_00,&PTR_construction_vtable_24__0092b810);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}